

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConverter.cpp
# Opt level: O0

vector<cali::StringConverter,_std::allocator<cali::StringConverter>_> * __thiscall
cali::StringConverter::rec_list
          (vector<cali::StringConverter,_std::allocator<cali::StringConverter>_>
           *__return_storage_ptr__,StringConverter *this,bool *okptr)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  char *in_RCX;
  char in_R8B;
  bool local_280;
  StringConverter local_260;
  string local_240;
  string local_220;
  int local_1fc;
  string local_1f8;
  undefined1 local_1d8 [8];
  string str;
  int d;
  istringstream local_1a8 [8];
  istringstream is;
  char local_23;
  byte local_22;
  char c;
  bool error;
  bool *okptr_local;
  StringConverter *this_local;
  vector<cali::StringConverter,_std::allocator<cali::StringConverter>_> *ret;
  
  std::vector<cali::StringConverter,_std::allocator<cali::StringConverter>_>::vector
            (__return_storage_ptr__);
  local_22 = 0;
  std::__cxx11::istringstream::istringstream(local_1a8,(string *)this,_S_in);
  str.field_2._8_4_ = 0;
  cVar1 = util::read_char((istream *)local_1a8);
  if (cVar1 == '[') {
    str.field_2._8_4_ = str.field_2._8_4_ + 1;
  }
  else {
    bVar2 = std::ios::good();
    if ((bVar2 & 1) != 0) {
      std::istream::unget();
    }
  }
  do {
    cVar1 = util::read_char((istream *)local_1a8);
    std::__cxx11::string::string((string *)local_1d8);
    if (cVar1 == '{') {
      std::__cxx11::string::operator=((string *)local_1d8,"{");
      in_RCX = (char *)0x0;
      util::read_nested_text_abi_cxx11_(&local_1f8,(util *)local_1a8,(istream *)0x7b,'}',in_R8B);
      std::__cxx11::string::append((string *)local_1d8);
      std::__cxx11::string::~string((string *)&local_1f8);
      local_23 = util::read_char((istream *)local_1a8);
      if (local_23 == '}') {
        std::__cxx11::string::append(local_1d8);
        goto LAB_00320131;
      }
      local_22 = 1;
      local_1fc = 2;
    }
    else {
      if (cVar1 == '[') {
        std::__cxx11::string::operator=((string *)local_1d8,"[");
        in_RCX = (char *)0x0;
        util::read_nested_text_abi_cxx11_(&local_220,(util *)local_1a8,(istream *)0x5b,']',in_R8B);
        std::__cxx11::string::append((string *)local_1d8);
        std::__cxx11::string::~string((string *)&local_220);
        local_23 = util::read_char((istream *)local_1a8);
        if (local_23 != ']') {
          local_22 = 1;
          local_1fc = 2;
          goto LAB_003201c3;
        }
        std::__cxx11::string::append(local_1d8);
      }
      else {
        std::istream::unget();
        util::read_word_abi_cxx11_(&local_240,(util *)local_1a8,(istream *)",]",in_RCX);
        std::__cxx11::string::operator=((string *)local_1d8,(string *)&local_240);
        std::__cxx11::string::~string((string *)&local_240);
      }
LAB_00320131:
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        StringConverter(&local_260,(string *)local_1d8);
        std::vector<cali::StringConverter,_std::allocator<cali::StringConverter>_>::push_back
                  (__return_storage_ptr__,&local_260);
        ~StringConverter(&local_260);
      }
      local_23 = util::read_char((istream *)local_1a8);
      local_1fc = 0;
    }
LAB_003201c3:
    std::__cxx11::string::~string((string *)local_1d8);
    if (local_1fc != 0) break;
    bVar2 = std::ios::good();
    in_RCX = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar2);
    local_280 = false;
    if ((bVar2 & 1) != 0) {
      local_280 = util::is_one_of(local_23,",");
    }
  } while (local_280 != false);
  if ((int)str.field_2._8_4_ < 1) {
    std::istream::unget();
  }
  else if (local_23 != ']') {
    local_22 = 1;
  }
  if (okptr != (bool *)0x0) {
    *okptr = (bool)((local_22 ^ 0xff) & 1);
  }
  local_1fc = 1;
  std::__cxx11::istringstream::~istringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::vector<cali::StringConverter> cali::StringConverter::rec_list(bool* okptr) const
{
    std::vector<StringConverter> ret;
    bool                         error = false;
    char                         c;

    std::istringstream is(m_str);

    int d = 0;
    c     = util::read_char(is);

    if (c == '[')
        ++d;
    else if (is.good())
        is.unget();

    do {
        c = util::read_char(is);
        std::string str;

        if (c == '{') {
            str = "{";
            str.append(util::read_nested_text(is, '{', '}'));

            c = util::read_char(is);
            if (c != '}') {
                error = true;
                break;
            }

            str.append("}");
        } else if (c == '[') {
            str = "[";
            str.append(util::read_nested_text(is, '[', ']'));

            c = util::read_char(is);
            if (c != ']') {
                error = true;
                break;
            }
            str.append("]");
        } else {
            is.unget();
            str = util::read_word(is, ",]");
        }

        if (!str.empty())
            ret.push_back(StringConverter(str));

        c = util::read_char(is);
    } while (is.good() && util::is_one_of(c, ","));

    if (d > 0) {
        if (c != ']')
            error = true;
    } else
        is.unget();

    if (okptr)
        *okptr = !error;

    return ret;
}